

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O0

storage_holder __thiscall
libtorrent::posix_disk_io::new_torrent
          (posix_disk_io *this,storage_params *params,shared_ptr<void> *param_2)

{
  bool bVar1;
  value_type *this_00;
  undefined8 extraout_RDX;
  storage_holder sVar2;
  strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void> local_3c;
  undefined1 local_38 [8];
  __single_object storage;
  storage_index_t idx;
  shared_ptr<void> *param_2_local;
  storage_params *params_local;
  posix_disk_io *this_local;
  
  storage._M_t.
  super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
  .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl._0_4_ =
       libtorrent::aux::
       container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
       ::end_index((container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
                    *)&params->mapped_files);
  storage._M_t.
  super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
  .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl._4_4_ =
       libtorrent::aux::storage_free_list::new_index
                 ((storage_free_list *)&params->priorities,
                  storage._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
                  .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl._0_4_
                 );
  ::std::make_unique<libtorrent::aux::posix_storage,libtorrent::storage_params_const&>
            ((storage_params *)local_38);
  local_3c = libtorrent::aux::
             container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
             ::end_index((container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
                          *)&params->mapped_files);
  bVar1 = libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>::
          operator==((strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void> *)
                     ((long)&storage._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
                             .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>.
                             _M_head_impl + 4),&local_3c);
  if (bVar1) {
    ::std::
    vector<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>,std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>>
    ::
    emplace_back<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>
              ((vector<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>,std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,std::default_delete<libtorrent::aux::posix_storage>>>>
                *)&params->mapped_files,
               (unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                *)local_38);
  }
  else {
    this_00 = libtorrent::aux::
              container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
              ::operator[]((container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
                            *)&params->mapped_files,
                           (strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>)
                           storage._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
                           .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>.
                           _M_head_impl._4_4_);
    ::std::
    unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
    ::operator=(this_00,(unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
                         *)local_38);
  }
  storage_holder::storage_holder
            ((storage_holder *)this,
             storage._M_t.
             super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::posix_storage_*,_std::default_delete<libtorrent::aux::posix_storage>_>
             .super__Head_base<0UL,_libtorrent::aux::posix_storage_*,_false>._M_head_impl._4_4_,
             (disk_interface *)params);
  ::std::
  unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>::
  ~unique_ptr((unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
               *)local_38);
  sVar2._8_8_ = extraout_RDX;
  sVar2.m_disk_io = &this->super_disk_interface;
  return sVar2;
}

Assistant:

storage_holder new_torrent(storage_params const& params
			, std::shared_ptr<void> const&) override
		{
			// make sure we can remove this torrent without causing a memory
			// allocation, by causing the allocation now instead
			storage_index_t const idx = m_free_slots.new_index(m_torrents.end_index());
			auto storage = std::make_unique<posix_storage>(params);
			if (idx == m_torrents.end_index()) m_torrents.emplace_back(std::move(storage));
			else m_torrents[idx] = std::move(storage);
			return storage_holder(idx, *this);
		}